

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression *
slang::ast::RangeSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,ConstantRange range,ASTContext *context)

{
  SourceRange *pSVar1;
  Scope *scope;
  DeferredSourceRange sourceRange;
  DeferredSourceRange sourceRange_00;
  bool bVar2;
  RangeSelectExpression *expr;
  Type *this;
  Expression *pEVar3;
  Type *pTVar4;
  Expression *left;
  Expression *right;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  uint local_78;
  byte local_73;
  Expression *local_70;
  Expression *local_68;
  SourceLocation local_60;
  SourceLocation SStack_58;
  undefined8 local_50;
  SourceLocation local_48;
  SourceLocation SStack_40;
  undefined8 local_38;
  
  SVInt::SVInt<int>((SVInt *)&local_80,range.left);
  local_70 = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_80);
  if (((0x40 < local_78) || ((local_73 & 1) != 0)) &&
     ((void *)CONCAT44(local_80.val._4_4_,local_80.val._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_80.val._4_4_,local_80.val._0_4_));
  }
  Expression::selfDetermined(context,&local_70);
  SVInt::SVInt<int>((SVInt *)&local_80,range.right);
  local_68 = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_80);
  if (((0x40 < local_78) || ((local_73 & 1) != 0)) &&
     ((void *)CONCAT44(local_80.val._4_4_,local_80.val._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_80.val._4_4_,local_80.val._0_4_));
  }
  Expression::selfDetermined(context,&local_68);
  local_80.val._0_4_ = 0;
  expr = BumpAllocator::
         emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,(RangeSelectionKind *)&local_80.val,
                    compilation->errorType,value,local_70,local_68,&value->sourceRange);
  bVar2 = Expression::bad(value);
  if (((!bVar2) && (bVar2 = Expression::bad(local_70), !bVar2)) &&
     (bVar2 = Expression::bad(local_68), !bVar2)) {
    pTVar4 = (value->type).ptr;
    this = getIndexedType(compilation,context,pTVar4,value->sourceRange,value->sourceRange,true);
    if (this->canonical == (Type *)0x0) {
      Type::resolveCanonical(this);
    }
    if ((this->canonical->super_Symbol).kind != ErrorType) {
      bVar2 = Type::isUnpackedArray(pTVar4);
      scope = (context->scope).ptr;
      pSVar1 = &(expr->super_Expression).sourceRange;
      local_60 = pSVar1->startLoc;
      SStack_58 = (expr->super_Expression).sourceRange.endLoc;
      if (bVar2) {
        local_38 = 1;
        sourceRange.node.value = 1;
        sourceRange.range = *pSVar1;
        local_48 = local_60;
        SStack_40 = SStack_58;
        pTVar4 = FixedSizeUnpackedArrayType::fromDim(scope,this,range,sourceRange);
      }
      else {
        local_50 = 1;
        sourceRange_00.node.value = 1;
        sourceRange_00.range = *pSVar1;
        pTVar4 = PackedArrayType::fromDim(scope,this,range,sourceRange_00);
      }
      (expr->super_Expression).type.ptr = pTVar4;
      return &expr->super_Expression;
    }
  }
  pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& RangeSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                ConstantRange range, const ASTContext& context) {
    Expression* left = &IntegerLiteral::fromConstant(compilation, range.left);
    selfDetermined(context, left);

    Expression* right = &IntegerLiteral::fromConstant(compilation, range.right);
    selfDetermined(context, right);

    auto result = compilation.emplace<RangeSelectExpression>(RangeSelectionKind::Simple,
                                                             compilation.getErrorType(), value,
                                                             *left, *right, value.sourceRange);
    if (value.bad() || left->bad() || right->bad())
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, value.sourceRange,
                                             value.sourceRange, true);

    if (elementType.isError())
        return badExpr(compilation, result);

    // This method is only called on expressions with a fixed range type.
    SLANG_ASSERT(range.isLittleEndian() == valueType.getFixedRange().isLittleEndian());
    SLANG_ASSERT(valueType.hasFixedRange());

    if (valueType.isUnpackedArray()) {
        result->type = &FixedSizeUnpackedArrayType::fromDim(*context.scope, elementType, range,
                                                            result->sourceRange);
    }
    else {
        result->type = &PackedArrayType::fromDim(*context.scope, elementType, range,
                                                 result->sourceRange);
    }

    return *result;
}